

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O2

void UI::execute_rotate(int *argc,char **argv)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  double theta_z;
  double ori_y;
  double ori_x;
  double theta_x;
  double ori_z;
  double theta_y;
  string outfile_path;
  string input_path;
  geofile primary_geofile;
  allocator<char> local_449;
  pointer local_448;
  string local_440;
  allocator<char> local_41c;
  allocator<char> local_41b;
  allocator<char> local_41a;
  allocator<char> local_419;
  double local_418;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  geofile local_210;
  
  if (*argc != 0xb) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"Error: incorrect argument count.",(allocator<char> *)&local_210
              );
    print_ln(&local_230);
    psVar3 = &local_230;
    goto LAB_0010bd01;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,argv[3],(allocator<char> *)&local_210);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_370,argv[4],(allocator<char> *)&local_210);
  GEO::geofile::geofile(&local_210);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_440,argv[5],(allocator<char> *)&local_418);
  bVar1 = GEO::is_e_notation(&local_440);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,argv[6],&local_449);
    bVar1 = GEO::is_e_notation(&local_3f0);
    if (!bVar1) {
LAB_0010bc98:
      std::__cxx11::string::~string((string *)&local_3f0);
      goto LAB_0010bca2;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,argv[7],&local_419);
    bVar1 = GEO::is_e_notation(&local_410);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&local_410);
      goto LAB_0010bc98;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,argv[8],&local_41a);
    bVar1 = GEO::is_e_notation(&local_3b0);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,argv[9],&local_41b);
      bVar1 = GEO::is_e_notation(&local_3d0);
      if (bVar1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,argv[10],&local_41c)
        ;
        bVar1 = GEO::is_e_notation(&local_390);
        std::__cxx11::string::~string((string *)&local_390);
      }
      else {
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&local_3d0);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_440);
    if (bVar1 == false) goto LAB_0010bcac;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,argv[5],(allocator<char> *)&local_410);
    local_448 = (pointer)std::__cxx11::stod(&local_440,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_440);
    local_3f0._M_dataplus._M_p = local_448;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,argv[6],(allocator<char> *)&local_3b0);
    local_448 = (pointer)std::__cxx11::stod(&local_440,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_440);
    local_410._M_dataplus._M_p = local_448;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,argv[7],(allocator<char> *)&local_3d0);
    local_448 = (pointer)std::__cxx11::stod(&local_440,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_440);
    local_3b0._M_dataplus._M_p = local_448;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,argv[8],(allocator<char> *)&local_390);
    local_448 = (pointer)std::__cxx11::stod(&local_440,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_440);
    local_3d0._M_dataplus._M_p = local_448;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,argv[9],(allocator<char> *)&local_418);
    local_448 = (pointer)std::__cxx11::stod(&local_440,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_440);
    local_390._M_dataplus._M_p = local_448;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,argv[10],&local_449);
    local_448 = (pointer)std::__cxx11::stod(&local_440,(size_t *)0x0);
    std::__cxx11::string::~string((string *)&local_440);
    local_418 = (double)local_448;
    std::__cxx11::string::string((string *)&local_270,(string *)&local_250);
    iVar2 = GEO::geofile::import_geofile(&local_210,&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    if (iVar2 == 0) {
      iVar2 = GEO::geofile::rotate_data
                        (&local_210,(double *)&local_3f0,(double *)&local_410,(double *)&local_3b0,
                         (double *)&local_3d0,(double *)&local_390,&local_418);
      if (iVar2 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_290,"Rotation completed.",(allocator<char> *)&local_440);
        print_ln(&local_290);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::string((string *)&local_2b0,(string *)&local_370);
        iVar2 = GEO::geofile::export_geofile(&local_210,&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        if (iVar2 == 0) {
          std::operator+(&local_2d0,"File exported as ",&local_370);
          print_ln(&local_2d0);
          psVar3 = &local_2d0;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,"Error: Export failed.",(allocator<char> *)&local_440);
          print_ln(&local_2f0);
          psVar3 = &local_2f0;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_310,"Error: Translation failed.",(allocator<char> *)&local_440);
        print_ln(&local_310);
        psVar3 = &local_310;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"Import of geofile failed.",(allocator<char> *)&local_440);
      print_ln(&local_330);
      psVar3 = &local_330;
    }
  }
  else {
LAB_0010bca2:
    std::__cxx11::string::~string((string *)&local_440);
LAB_0010bcac:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"Error: Shifting parameters unrecognized. Terminating.",
               (allocator<char> *)&local_440);
    print_ln(&local_350);
    psVar3 = &local_350;
  }
  std::__cxx11::string::~string((string *)psVar3);
  GEO::geofile::~geofile(&local_210);
  std::__cxx11::string::~string((string *)&local_370);
  psVar3 = &local_250;
LAB_0010bd01:
  std::__cxx11::string::~string((string *)psVar3);
  return;
}

Assistant:

void UI::execute_rotate(int &argc, char *argv[])
{
    if (argc!=11)
    {
        print_ln("Error: incorrect argument count.");
    }
    else
    {
        std::string input_path   = argv[3];
        std::string outfile_path = argv[4];
        GEO::geofile primary_geofile;
        if ((GEO::is_e_notation(argv[5]))&&
            (GEO::is_e_notation(argv[6]))&&
            (GEO::is_e_notation(argv[7]))&&
            (GEO::is_e_notation(argv[8]))&&
            (GEO::is_e_notation(argv[9]))&&
            (GEO::is_e_notation(argv[10])))
        {
            double ori_x = std::stod(argv[5]);
            double ori_y = std::stod(argv[6]);
            double ori_z = std::stod(argv[7]);
            double theta_x = std::stod(argv[8]);
            double theta_y = std::stod(argv[9]);
            double theta_z = std::stod(argv[10]);
            if(primary_geofile.import_geofile(input_path)==EXIT_SUCCESS)
            {
                if(primary_geofile.rotate_data( ori_x,   ori_y,   ori_z,
                                                theta_x, theta_y, theta_z)==EXIT_SUCCESS)
                {
                    print_ln("Rotation completed.");
                    if(primary_geofile.export_geofile(outfile_path)==EXIT_SUCCESS)
                        print_ln(("File exported as "+outfile_path));
                    else
                        print_ln("Error: Export failed.");
                }
                else
                    print_ln("Error: Translation failed.");
            }
            else
                print_ln("Import of geofile failed.");
        }
        else
            print_ln("Error: Shifting parameters unrecognized. Terminating.");
    }
}